

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int imcomp_write_nocompress_tile
              (fitsfile *outfptr,long row,int datatype,void *tiledata,long tilelen,int nullcheck,
              void *nullflagval,int *status)

{
  char local_40 [4];
  int local_3c;
  char coltype [4];
  int nullcheck_local;
  long tilelen_local;
  void *tiledata_local;
  int datatype_local;
  long row_local;
  fitsfile *outfptr_local;
  
  local_3c = nullcheck;
  _coltype = tilelen;
  if (outfptr->Fptr->cn_uncompressed < 1) {
    if (datatype == 0x15) {
      strcpy(local_40,"1PI");
    }
    else if (datatype == 0x1f) {
      strcpy(local_40,"1PJ");
    }
    else {
      if (datatype != 0x2a) {
        ffpmsg("NOCOMPRESSION option only supported for int*2, int*4, and float*4 images");
        *status = 0x19d;
        return 0x19d;
      }
      strcpy(local_40,"1QE");
    }
    fficol(outfptr,999,"UNCOMPRESSED_DATA",local_40,status);
  }
  ffgcno(outfptr,0,"UNCOMPRESSED_DATA",&outfptr->Fptr->cn_uncompressed,status);
  ffpcl(outfptr,datatype,outfptr->Fptr->cn_uncompressed,row,1,_coltype,tiledata,status);
  return *status;
}

Assistant:

int imcomp_write_nocompress_tile(fitsfile *outfptr,
    long row,
    int datatype, 
    void *tiledata, 
    long tilelen,
    int nullcheck,
    void *nullflagval,
    int *status)
{
    char coltype[4];

    /* Write the uncompressed image tile pixels to the tile-compressed image file. */
    /* This is a special case when using NOCOMPRESS for diagnostic purposes in fpack. */ 
    /* Currently, this only supports a limited number of data types and */
    /* does not fully support null-valued pixels in the image. */

    if ((outfptr->Fptr)->cn_uncompressed < 1) {
        /* uncompressed data column doesn't exist, so append new column to table */
        if (datatype == TSHORT) {
	    strcpy(coltype, "1PI");
	} else if (datatype == TINT) {
	    strcpy(coltype, "1PJ");
	} else if (datatype == TFLOAT) {
	    strcpy(coltype, "1QE");
        } else {
	    ffpmsg("NOCOMPRESSION option only supported for int*2, int*4, and float*4 images");
            return(*status = DATA_COMPRESSION_ERR);
        }

        fits_insert_col(outfptr, 999, "UNCOMPRESSED_DATA", coltype, status); /* create column */
    }

    fits_get_colnum(outfptr, CASEINSEN, "UNCOMPRESSED_DATA",
                    &(outfptr->Fptr)->cn_uncompressed, status);  /* save col. num. */
    
    fits_write_col(outfptr, datatype, (outfptr->Fptr)->cn_uncompressed, row, 1,
                      tilelen, tiledata, status);  /* write the tile data */
    return (*status);
}